

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

Vector<double,_2> __thiscall tcu::normalize<double,2>(tcu *this,Vector<double,_2> *a)

{
  int i;
  long lVar1;
  Type TVar2;
  double dVar3;
  Vector<double,_2> VVar4;
  
  TVar2 = length<double,2>(a);
  VVar4.m_data[1] = 1.0 / TVar2;
  dVar3 = 0.0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    dVar3 = a->m_data[lVar1] * VVar4.m_data[1];
    *(double *)(this + lVar1 * 8) = dVar3;
  }
  VVar4.m_data[0] = dVar3;
  return (Vector<double,_2>)VVar4.m_data;
}

Assistant:

inline Vector<T, Size> normalize (const Vector<T, Size>& a)
{
	T ooLen = T(1) / length(a);
	Vector<T, Size> res;
	for (int i = 0; i < Size; i++)
		res.m_data[i] = ooLen * a.m_data[i];
	return res;
}